

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O0

bool __thiscall pbrt::TransformSet::IsAnimated(TransformSet *this)

{
  bool bVar1;
  Transform *in_RDI;
  int i;
  Transform *in_stack_ffffffffffffffd8;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if (0 < local_14) {
      return false;
    }
    bVar1 = Transform::operator!=(in_RDI,in_stack_ffffffffffffffd8);
    if (bVar1) break;
    local_14 = local_14 + 1;
  }
  return true;
}

Assistant:

bool IsAnimated() const {
        for (int i = 0; i < MaxTransforms - 1; ++i)
            if (t[i] != t[i + 1])
                return true;
        return false;
    }